

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffImage *diff)

{
  TexelBlockPtr<unsigned_char_*> *this_00;
  OutputFormat OVar1;
  PrintIndent *pPVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  DiffImage *pDVar7;
  bool bVar8;
  ulong uVar9;
  PrintDiff *pPVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  char *this_01;
  ostream *os;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  TexelBlockPtr<unsigned_char_*> *pTVar14;
  pointer ppVar15;
  PrintDiff *pPVar16;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_string_view<char> format_str_22;
  basic_string_view<char> format_str_23;
  basic_string_view<char> format_str_24;
  basic_string_view<char> format_str_25;
  basic_string_view<char> format_str_26;
  basic_string_view<char> format_str_27;
  basic_string_view<char> format_str_28;
  basic_string_view<char> format_str_29;
  basic_string_view<char> format_str_30;
  basic_string_view<char> format_str_31;
  basic_string_view<char> format_str_32;
  basic_string_view<char> format_str_33;
  basic_string_view<char> format_str_34;
  basic_string_view<char> format_str_35;
  basic_string_view<char> format_str_36;
  basic_string_view<char> format_str_37;
  basic_string_view<char> format_str_38;
  basic_string_view<char> format_str_39;
  basic_string_view<char> format_str_40;
  basic_string_view<char> format_str_41;
  basic_string_view<char> format_str_42;
  basic_string_view<char> format_str_43;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_15;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_16;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_17;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_18;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_19;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_20;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_21;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_22;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_23;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_24;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_25;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_26;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_27;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_28;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_29;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_30;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_31;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_32;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_33;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_34;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_35;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_36;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_37;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_38;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_39;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_40;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_41;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_42;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_43;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_44;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_45;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_46;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_47;
  uvec4 uVar17;
  uvec4 uVar18;
  anon_class_8_1_a8a2e026 formatChannels;
  anon_class_8_1_a8a2e026 formatPacked;
  string comma;
  string local_210;
  pointer local_1f0;
  PrintDiff *local_1e8;
  size_t sStack_1e0;
  PrintDiff *local_1d8;
  size_type sStack_1d0;
  PrintDiff *local_1c8;
  size_type sStack_1c0;
  PrintDiff *local_1b8;
  pointer local_1a8;
  size_type sStack_1a0;
  PrintDiff *local_198;
  PrintDiff *local_188;
  PrintDiff *local_178;
  PrintDiff *local_168;
  pointer local_150;
  DiffImage *local_148;
  PrintDiff *local_140;
  PrintDiff *local_138;
  undefined1 local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  __string_type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  __string_type local_50;
  
  this->different = true;
  OVar1 = this->outputFormat;
  pPVar16 = (PrintDiff *)0x1fecc1;
  if (OVar1 == json_mini) {
    pPVar16 = (PrintDiff *)0x217ddc;
  }
  pPVar10 = (PrintDiff *)0x1fcdf2;
  if (OVar1 == json_mini) {
    pPVar10 = (PrintDiff *)0x217ddc;
  }
  local_148 = diff;
  local_140 = pPVar16;
  local_138 = pPVar16;
  if (OVar1 == text) {
    printContext(this);
    pPVar2 = this->printIndent;
    local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
    local_1e8 = (PrintDiff *)0x217ddc;
    format_str_38.size_ = 5;
    format_str_38.data_ = "{:{}}";
    args_42.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
    args_42.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(pPVar2->os,format_str_38,args_42);
    sStack_1e0 = (diff->textHeader)._M_len;
    local_1e8 = (PrintDiff *)(diff->textHeader)._M_str;
    format_str_39.size_ = 4;
    format_str_39.data_ = "+{}\n";
    args_43.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
    args_43.desc_ = 0xd;
    ::fmt::v10::vprint<char>(pPVar2->os,format_str_39,args_43);
    ppVar15 = (diff->texelBlockPairList->
              super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_150 = (diff->texelBlockPairList->
                super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar15 == local_150) {
      return;
    }
    local_1f0 = (pointer)&local_f0.field_2;
    pTVar14 = &ppVar15->second;
    do {
      this_00 = pTVar14 + -1;
      uVar17 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation(this_00);
      uVar9 = uVar17.field_0._0_8_;
      uVar18 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation(pTVar14);
      if (((uVar17.field_0._0_4_ != uVar18.field_0._0_4_) ||
          ((uVar18.field_0._0_8_ ^ uVar9) >> 0x20 != 0)) ||
         (uVar17.field_0._8_8_ != uVar18.field_0._8_8_)) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2d6,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_40.size_ = 5;
      format_str_40.data_ = "{:{}}";
      args_44.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_44.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_40,args_44);
      local_1e8 = (PrintDiff *)(uVar9 & 0xffffffff);
      local_1d8 = (PrintDiff *)(uVar9 >> 0x20);
      local_1c8 = (PrintDiff *)(uVar17.field_0._8_8_ & 0xffffffff);
      format_str_41.size_ = 0x1a;
      format_str_41.data_ = "  Coordinates: {}, {}, {}\n";
      args_45.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_45.desc_ = 0x222;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_41,args_45);
      pPVar16 = (PrintDiff *)(pTVar14[-1].ptr + -(long)(pTVar14[-1].span)->pixels);
      if (pPVar16 != (PrintDiff *)(pTVar14->ptr + -(long)pTVar14->span->pixels)) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2db,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_42.size_ = 5;
      format_str_42.data_ = "{:{}}";
      args_46.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_46.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_42,args_46);
      format_str_43.size_ = 0x1e;
      format_str_43.data_ = "    Image byte offset: 0x{:x}\n";
      args_47.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_47.desc_ = 3;
      local_1e8 = pPVar16;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_43,args_47);
      pDVar7 = local_148;
      if (local_148->fileOffsets[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_1e8 = (PrintDiff *)
                    ((long)&pPVar16->printIndent +
                    local_148->fileOffsets[0].super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value);
        pcVar12 = (char *)0x6;
        sVar11 = 4;
        this_01 = "0x{:x}";
      }
      else {
        pcVar12 = (char *)0x3;
        this_01 = "N/A";
        sVar11 = 0;
      }
      fmt_02.size_ = sVar11;
      fmt_02.data_ = pcVar12;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)&local_1e8;
      local_130._0_8_ = this;
      ::fmt::v10::vformat_abi_cxx11_(&local_f0,(v10 *)this_01,fmt_02,args_04);
      if (pDVar7->fileOffsets[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_1e8 = (PrintDiff *)
                    ((long)&pPVar16->printIndent +
                    pDVar7->fileOffsets[1].super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value);
        fmt_03.size_ = 4;
        fmt_03.data_ = (char *)0x6;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_d0,(v10 *)0x1fd067,fmt_03,args_05);
      }
      else {
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_d0,(v10 *)"N/A",(string_view)ZEXT816(3),args_06);
      }
      operator<<::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)local_130,"File byte offset",&local_f0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_50,&local_138,this_00,false);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_90,&local_138,pTVar14,false);
      operator<<::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)local_130,"Packed",&local_50,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (((uint)(pTVar14[-1].span)->codec->flags & 2) == 0) {
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (&local_70,&local_140,this_00,false);
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_140,pTVar14,false);
        operator<<::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)local_130,"Channels",&local_70,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_allocated_capacity != &local_a0) {
          operator_delete((void *)local_b0._M_allocated_capacity,local_a0._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      ppVar15 = (pointer)(pTVar14 + 1);
      pTVar14 = pTVar14 + 2;
    } while (ppVar15 != local_150);
    return;
  }
  beginJsonOutput(this);
  pPVar2 = this->printIndent;
  local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 2) * pPVar2->indentWidth);
  local_1e8 = (PrintDiff *)0x217ddc;
  format_str.size_ = 5;
  format_str.data_ = "{:{}}";
  args_07.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
  args_07.desc_ = 0x1c;
  ::fmt::v10::vprint<char>(pPVar2->os,format_str,args_07);
  sStack_1e0 = (diff->fragmentUri)._M_len;
  local_1e8 = (PrintDiff *)(diff->fragmentUri)._M_str;
  format_str_00.size_ = 8;
  format_str_00.data_ = "\"{}\":{}[";
  args_08.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
  args_08.desc_ = 0xcd;
  local_1d8 = pPVar16;
  ::fmt::v10::vprint<char>(pPVar2->os,format_str_00,args_08);
  ppVar15 = (diff->texelBlockPairList->
            super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (diff->texelBlockPairList->
              super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != local_1f0) {
    bVar8 = true;
    pTVar14 = &ppVar15->second;
    do {
      if (bVar8) {
        local_130._0_8_ = local_130 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"","");
      }
      else {
        fmt.size_ = 0xc;
        fmt.data_ = (char *)0x3;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_1e8;
        local_1e8 = pPVar16;
        ::fmt::v10::vformat_abi_cxx11_((string *)local_130,(v10 *)0x1fbf4e,fmt,args);
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:{}}";
      args_09.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_09.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_01,args_09);
      local_1e8 = (PrintDiff *)local_130._0_8_;
      sStack_1e0 = local_130._8_8_;
      format_str_02.size_ = 4;
      format_str_02.data_ = "{}{}";
      args_10.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_10.desc_ = 0xcd;
      local_1d8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_02,args_10);
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_03.size_ = 5;
      format_str_03.data_ = "{:{}}";
      args_11.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_11.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_03,args_11);
      format_str_04.size_ = 4;
      format_str_04.data_ = "{{{}";
      args_12.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_12.desc_ = 0xc;
      local_1e8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_04,args_12);
      local_150 = (pointer)(pTVar14 + -1);
      uVar17 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                         ((TexelBlockPtr<unsigned_char_*> *)local_150);
      uVar9 = uVar17.field_0._0_8_;
      uVar18 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation(pTVar14);
      if (((uVar17.field_0._0_4_ != uVar18.field_0._0_4_) ||
          ((uVar18.field_0._0_8_ ^ uVar9) >> 0x20 != 0)) ||
         (uVar17.field_0._8_8_ != uVar18.field_0._8_8_)) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2fc,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_05.size_ = 5;
      format_str_05.data_ = "{:{}}";
      args_13.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_13.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_05,args_13);
      local_1c8 = (PrintDiff *)(uVar9 & 0xffffffff);
      local_1a8 = (pointer)(uVar9 >> 0x20);
      local_188 = (PrintDiff *)(uVar17.field_0._8_8_ & 0xffffffff);
      format_str_06.size_ = 0x25;
      format_str_06.data_ = "\"coordinates\":{}[{}{},{}{},{}{}{}],{}";
      args_14.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_14.desc_ = 0xcc2c2c2cc;
      local_1e8 = pPVar16;
      local_1d8 = pPVar16;
      local_1b8 = pPVar16;
      local_198 = pPVar16;
      local_178 = pPVar16;
      local_168 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_06,args_14);
      lVar13 = (long)pTVar14[-1].ptr - (long)(pTVar14[-1].span)->pixels;
      if (lVar13 != (long)pTVar14->ptr - (long)pTVar14->span->pixels) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x302,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_07.size_ = 5;
      format_str_07.data_ = "{:{}}";
      args_15.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_15.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_07,args_15);
      format_str_08.size_ = 0x24;
      format_str_08.data_ = "\"imageByteOffset\":{}[{}{},{}{}{}],{}";
      args_16.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_16.desc_ = 0xcc3c3cc;
      local_1e8 = pPVar16;
      local_1d8 = pPVar16;
      local_1c8 = (PrintDiff *)lVar13;
      local_1b8 = pPVar16;
      local_1a8 = (pointer)lVar13;
      local_198 = pPVar16;
      local_188 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_08,args_16);
      pPVar2 = this->printIndent;
      if (local_148->fileOffsets[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_1e8 = (PrintDiff *)
                    (local_148->fileOffsets[0].super__Optional_base<unsigned_long,_true,_true>.
                     _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value +
                    lVar13);
        fmt_00.size_ = 4;
        fmt_00.data_ = (char *)0x2;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_210,(v10 *)0x20ab83,fmt_00,args_00);
      }
      else {
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_210,(v10 *)0x21f60d,(string_view)ZEXT816(4),args_01);
      }
      if (local_148->fileOffsets[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_1e8 = (PrintDiff *)
                    (lVar13 + local_148->fileOffsets[1].
                              super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._M_payload._M_value);
        fmt_01.size_ = 4;
        fmt_01.data_ = (char *)0x2;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_110,(v10 *)0x20ab83,fmt_01,args_02);
      }
      else {
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)&local_1e8;
        ::fmt::v10::vformat_abi_cxx11_(&local_110,(v10 *)0x21f60d,(string_view)ZEXT816(4),args_03);
      }
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_09.size_ = 5;
      format_str_09.data_ = "{:{}}";
      args_17.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_17.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_09,args_17);
      local_1c8 = (PrintDiff *)local_210._M_dataplus._M_p;
      sStack_1c0 = local_210._M_string_length;
      local_1a8 = local_110._M_dataplus._M_p;
      sStack_1a0 = local_110._M_string_length;
      format_str_10.size_ = 0x23;
      format_str_10.data_ = "\"fileByteOffset\":{}[{}{},{}{}{}],{}";
      args_18.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_18.desc_ = 0xccdcdcc;
      local_1e8 = pPVar16;
      local_1d8 = pPVar16;
      local_1b8 = pPVar16;
      local_198 = pPVar16;
      local_188 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_10,args_18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_11.size_ = 5;
      format_str_11.data_ = "{:{}}";
      args_19.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_19.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_11,args_19);
      format_str_12.size_ = 0xe;
      format_str_12.data_ = "\"packed\":{}[{}";
      args_20.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_20.desc_ = 0xcc;
      local_1e8 = pPVar16;
      local_1d8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_12,args_20);
      pPVar2 = this->printIndent;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_210,&local_138,&local_150->first,true);
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 5) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_13.size_ = 5;
      format_str_13.data_ = "{:{}}";
      args_21.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_21.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_13,args_21);
      local_1d8 = (PrintDiff *)local_210._M_dataplus._M_p;
      sStack_1d0 = local_210._M_string_length;
      format_str_14.size_ = 0xb;
      format_str_14.data_ = "[{}{}{}],{}";
      args_22.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_22.desc_ = 0xccdc;
      local_1e8 = pPVar16;
      local_1c8 = pPVar16;
      local_1b8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_14,args_22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = this->printIndent;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_210,&local_138,pTVar14,true);
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 5) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_15.size_ = 5;
      format_str_15.data_ = "{:{}}";
      args_23.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_23.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_15,args_23);
      local_1d8 = (PrintDiff *)local_210._M_dataplus._M_p;
      sStack_1d0 = local_210._M_string_length;
      format_str_16.size_ = 10;
      format_str_16.data_ = "[{}{}{}]{}";
      args_24.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_24.desc_ = 0xccdc;
      local_1e8 = pPVar16;
      local_1c8 = pPVar16;
      local_1b8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_16,args_24);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_17.size_ = 5;
      format_str_17.data_ = "{:{}}";
      args_25.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_25.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_17,args_25);
      format_str_18.size_ = 1;
      format_str_18.data_ = "]";
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      ::fmt::v10::vprint<char>
                (pPVar2->os,format_str_18,
                 (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
                 (auVar3 << 0x40));
      if (((uint)(pTVar14[-1].span)->codec->flags & 2) == 0) {
        pPVar2 = this->printIndent;
        local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
        local_1e8 = (PrintDiff *)0x217ddc;
        format_str_19.size_ = 5;
        format_str_19.data_ = "{:{}}";
        args_26.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_26.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_19,args_26);
        format_str_20.size_ = 3;
        format_str_20.data_ = ",{}";
        args_27.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_27.desc_ = 0xc;
        local_1e8 = pPVar10;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_20,args_27);
        pPVar2 = this->printIndent;
        local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
        local_1e8 = (PrintDiff *)0x217ddc;
        format_str_21.size_ = 5;
        format_str_21.data_ = "{:{}}";
        args_28.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_28.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_21,args_28);
        format_str_22.size_ = 0x10;
        format_str_22.data_ = "\"channels\":{}[{}";
        args_29.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_29.desc_ = 0xcc;
        local_1e8 = pPVar16;
        local_1d8 = pPVar10;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_22,args_29);
        pPVar2 = this->printIndent;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (&local_210,&local_140,&local_150->first,true);
        local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 5) * pPVar2->indentWidth);
        local_1e8 = (PrintDiff *)0x217ddc;
        format_str_23.size_ = 5;
        format_str_23.data_ = "{:{}}";
        args_30.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_30.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_23,args_30);
        local_1d8 = (PrintDiff *)local_210._M_dataplus._M_p;
        sStack_1d0 = local_210._M_string_length;
        format_str_24.size_ = 0xb;
        format_str_24.data_ = "[{}{}{}],{}";
        args_31.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_31.desc_ = 0xccdc;
        local_1e8 = pPVar16;
        local_1c8 = pPVar16;
        local_1b8 = pPVar10;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_24,args_31);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        pPVar2 = this->printIndent;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (&local_210,&local_140,pTVar14,true);
        local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 5) * pPVar2->indentWidth);
        local_1e8 = (PrintDiff *)0x217ddc;
        format_str_25.size_ = 5;
        format_str_25.data_ = "{:{}}";
        args_32.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_32.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_25,args_32);
        local_1d8 = (PrintDiff *)local_210._M_dataplus._M_p;
        sStack_1d0 = local_210._M_string_length;
        format_str_26.size_ = 10;
        format_str_26.data_ = "[{}{}{}]{}";
        args_33.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_33.desc_ = 0xccdc;
        local_1e8 = pPVar16;
        local_1c8 = pPVar16;
        local_1b8 = pPVar10;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_26,args_33);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        pPVar2 = this->printIndent;
        local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 4) * pPVar2->indentWidth);
        local_1e8 = (PrintDiff *)0x217ddc;
        format_str_27.size_ = 5;
        format_str_27.data_ = "{:{}}";
        args_34.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
        args_34.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_27,args_34);
        format_str_28.size_ = 1;
        format_str_28.data_ = "]";
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                       &local_1e8;
        ::fmt::v10::vprint<char>
                  (pPVar2->os,format_str_28,
                   (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
                   (auVar4 << 0x40));
      }
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_29.size_ = 5;
      format_str_29.data_ = "{:{}}";
      args_35.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_35.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_29,args_35);
      format_str_30.size_ = 2;
      format_str_30.data_ = "{}";
      args_36.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_36.desc_ = 0xc;
      local_1e8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_30,args_36);
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_31.size_ = 5;
      format_str_31.data_ = "{:{}}";
      args_37.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_37.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_31,args_37);
      format_str_32.size_ = 2;
      format_str_32.data_ = "}}";
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      ::fmt::v10::vprint<char>
                (pPVar2->os,format_str_32,
                 (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
                 (auVar5 << 0x40));
      if ((PrintDiff *)local_130._0_8_ != (PrintDiff *)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
      }
      ppVar15 = (pointer)(pTVar14 + 1);
      bVar8 = false;
      pTVar14 = pTVar14 + 2;
    } while (ppVar15 != local_1f0);
    if ((local_148->texelBlockPairList->
        super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (local_148->texelBlockPairList->
        super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_33.size_ = 5;
      format_str_33.data_ = "{:{}}";
      args_38.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_38.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_33,args_38);
      format_str_34.size_ = 2;
      format_str_34.data_ = "{}";
      args_39.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_39.desc_ = 0xc;
      local_1e8 = pPVar10;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_34,args_39);
      pPVar2 = this->printIndent;
      local_1d8 = (PrintDiff *)(ulong)(uint)((pPVar2->indentBase + 2) * pPVar2->indentWidth);
      local_1e8 = (PrintDiff *)0x217ddc;
      format_str_35.size_ = 5;
      format_str_35.data_ = "{:{}}";
      args_40.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
      args_40.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_35,args_40);
      os = pPVar2->os;
      goto LAB_0013e98d;
    }
  }
  pPVar2 = this->printIndent;
  local_1d8 = (PrintDiff *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
  local_1e8 = (PrintDiff *)0x217ddc;
  format_str_36.size_ = 5;
  format_str_36.data_ = "{:{}}";
  args_41.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
  args_41.desc_ = 0x1c;
  ::fmt::v10::vprint<char>(pPVar2->os,format_str_36,args_41);
  os = pPVar2->os;
LAB_0013e98d:
  format_str_37.size_ = 1;
  format_str_37.data_ = "]";
  auVar6._8_8_ = 0;
  auVar6._0_8_ = &local_1e8;
  ::fmt::v10::vprint<char>
            (os,format_str_37,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar6 << 0x40));
  return;
}

Assistant:

void operator<<(const DiffImage& diff) {
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        auto formatOptionalFileOffset = [](const std::optional<std::size_t>& fileOffset, std::size_t imageOffset, bool json) {
            if (fileOffset.has_value())
                return fmt::format(json ? "{}" : "0x{:x}", *fileOffset + imageOffset);
            else
                return fmt::format(json ? "null" : "N/A");
        };

        auto formatPacked = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            const uint32_t hexDigits = texelBlock.getPackedElementByteSize() << 1;
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            for (uint32_t elementIdx = 0; elementIdx < texelBlock.getPackedElementCount(); ++elementIdx) {
                const uint32_t element = texelBlock.getPackedElement(elementIdx);
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                fmt::print(formattedValue, "{}{}0x{:0{}x}{}", comma, quote, element, hexDigits, quote);
            }
            return formattedValue.str();
        };

        auto formatChannels = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            // If decodable channels are not available (e.g. block compressed), then this should not be called
            assert(texelBlock.getChannelCount() != 0);
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            // Prefer to decode to integer (e.g. UNORM will be output as list of integer values instead of float values)
            if (texelBlock.canDecodeUINT()) {
                // Unsigned integer channels
                const glm::uvec4 channels = texelBlock.decodeUINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeSINT()) {
                // Signed integer channels
                const glm::ivec4 channels = texelBlock.decodeSINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeFLOAT()) {
                // Floating point channels
                const glm::vec4 channels = texelBlock.decodeFLOAT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    float channel = channels[channelIdx];
                    if (std::isinf(channel)) {
                        // Output signed infinity (optionally quoted)
                        const auto sign = std::signbit(channel) ? "-" : "+";
                        fmt::print(formattedValue, "{}{}{}inf{}", comma, quote, sign, quote);
                    } else if (std::isnan(channel)) {
                        // Output signed not-a-number (optionally quoted)
                        fmt::print(formattedValue, "{}{}nan{}", comma, quote, quote);
                    } else {
                        // Output signed value (explicitly handle sign bit to differentiate between +0.0 and -0.0)
                        // However, we only output sign for negative values because JSON does not allow leading "+"
                        const auto sign = std::signbit(channel) ? "-" : "";
                        fmt::print(formattedValue, "{}{}{}", comma, sign, std::abs(channel));
                    }
                }
            } else {
                // Unexpected format
                assert(false);
                return std::string("");
            }
            return formattedValue.str();
        };

        if (outputFormat == OutputFormat::text) {
            printContext();
            printIndent(0, "+{}\n", diff.textHeader);
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(0, "  Coordinates: {}, {}, {}\n", pixelCoords.x, pixelCoords.y, pixelCoords.z);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(0, "    Image byte offset: 0x{:x}\n", imageByteOffset);

                auto printDiff = [=](const char* textHeader, const std::string firstValue, const std::string secondValue) {
                    if (firstValue == secondValue) {
                        printIndent(0, "    {}: {}\n", textHeader, firstValue);
                    } else {
                        printIndent(0, "-    {}: {}\n", textHeader, firstValue);
                        printIndent(0, "+    {}: {}\n", textHeader, secondValue);
                    }
                };

                printDiff("File byte offset",
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, false),
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, false));

                printDiff("Packed", formatPacked(texelBlockPair.first, false), formatPacked(texelBlockPair.second, false));

                // Only output chnalles if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed())
                    printDiff("Channels", formatChannels(texelBlockPair.first, false), formatChannels(texelBlockPair.second, false));
            }
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[", diff.fragmentUri, space);
            bool first = true;
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                printIndent(0, "{}{}", comma, nl);
                printIndent(3, "{{{}", nl);

                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(4, "\"coordinates\":{}[{}{},{}{},{}{}{}],{}", space, space,
                    pixelCoords.x, space, pixelCoords.y, space, pixelCoords.z, space, nl);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(4, "\"imageByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    imageByteOffset, space, imageByteOffset, space, nl);

                printIndent(4, "\"fileByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, true), space,
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, true), space, nl);

                printIndent(4, "\"packed\":{}[{}", space, nl);
                printIndent(5, "[{}{}{}],{}", space, formatPacked(texelBlockPair.first, true), space, nl);
                printIndent(5, "[{}{}{}]{}", space, formatPacked(texelBlockPair.second, true), space, nl);
                printIndent(4, "]");

                // Only output channels if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed()) {
                    printIndent(0, ",{}", nl);
                    printIndent(4, "\"channels\":{}[{}", space, nl);
                    printIndent(5, "[{}{}{}],{}", space, formatChannels(texelBlockPair.first, true), space, nl);
                    printIndent(5, "[{}{}{}]{}", space, formatChannels(texelBlockPair.second, true), space, nl);
                    printIndent(4, "]");
                }

                printIndent(0, "{}", nl);
                printIndent(3, "}}");
            }
            if (diff.texelBlockPairList.empty()) {
                printIndent(0, "]");
            } else {
                printIndent(0, "{}", nl);
                printIndent(2, "]");
            }
        }
    }